

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_util.h
# Opt level: O3

bool google::protobuf::
     InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,google::protobuf::FileDescriptorProto_const*,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>>
               (map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>_>
                *collection,first_type *key,second_type *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>_>,_bool>
  pVar3;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_const_google::protobuf::FileDescriptorProto_*>
  local_58;
  
  paVar1 = &local_58.first.first.field_2;
  pcVar2 = (key->first)._M_dataplus._M_p;
  local_58.first.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (key->first)._M_string_length);
  local_58.first.second = key->second;
  local_58.second = *value;
  pVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>
          ::
          _M_insert_unique<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>const&>
                    ((_Rb_tree<std::pair<std::__cxx11::string,int>,std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,google::protobuf::FileDescriptorProto_const*>>>
                      *)collection,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.first.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.first.first._M_dataplus._M_p);
  }
  return (bool)(pVar3.second & 1);
}

Assistant:

bool InsertIfNotPresent(
    Collection* const collection,
    const typename Collection::value_type::first_type& key,
    const typename Collection::value_type::second_type& value) {
  return InsertIfNotPresent(
      collection, typename Collection::value_type(key, value));
}